

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64_encode.c
# Opt level: O2

void base64_encode_bs(BinarySink *bs,ptrlen input,int cpl)

{
  size_t sVar1;
  size_t sVar2;
  ulong wanted;
  size_t i;
  long lVar3;
  int iVar4;
  ptrlen pVar5;
  char b64atom [4];
  BinarySource src [1];
  
  src[0].data = input.ptr;
  src[0].binarysource_ = src;
  src[0].pos = 0;
  src[0].err = BSE_NO_ERROR;
  sVar1 = 0;
  iVar4 = 0;
  sVar2 = input.len;
  src[0].len = sVar2;
  while (wanted = sVar2 - sVar1, wanted != 0) {
    if (2 < wanted) {
      wanted = 3;
    }
    pVar5 = BinarySource_get_data(src[0].binarysource_,wanted);
    base64_encode_atom((uchar *)pVar5.ptr,(int)pVar5.len,b64atom);
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      if (cpl <= iVar4 && 0 < cpl) {
        BinarySink_put_byte(bs->binarysink_,'\n');
        iVar4 = 0;
      }
      BinarySink_put_byte(bs->binarysink_,b64atom[lVar3]);
      iVar4 = iVar4 + 1;
    }
    sVar1 = (src[0].binarysource_)->pos;
    sVar2 = (src[0].binarysource_)->len;
  }
  if (0 < cpl) {
    BinarySink_put_byte(bs->binarysink_,'\n');
  }
  return;
}

Assistant:

void base64_encode_bs(BinarySink *bs, ptrlen input, int cpl)
{
    BinarySource src[1];
    BinarySource_BARE_INIT_PL(src, input);
    int linelen = 0;

    while (get_avail(src)) {
        size_t n = get_avail(src) < 3 ? get_avail(src) : 3;
        ptrlen binatom = get_data(src, n);

        char b64atom[4];
        base64_encode_atom(binatom.ptr, binatom.len, b64atom);
        for (size_t i = 0; i < 4; i++) {
            if (cpl > 0 && linelen >= cpl) {
                linelen = 0;
                put_byte(bs, '\n');
            }
            put_byte(bs, b64atom[i]);
            linelen++;
        }
    }
    if (cpl > 0)
        put_byte(bs, '\n');
}